

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gotcha_utils.c
# Opt level: O3

void gotcha_init(void)

{
  char *pcVar1;
  
  if (gotcha_init_gotcha_initialized != '\0') {
    return;
  }
  gotcha_init_gotcha_initialized = 1;
  if (debug_init_debug_initialized == '\0') {
    debug_init_debug_initialized = '\x01';
    pcVar1 = getenv("GOTCHA_DEBUG");
    if (pcVar1 != (char *)0x0) {
      gotcha_init_cold_1();
    }
  }
  create_hashtable(&library_table,0x80,link_map_hash,link_map_cmp);
  create_hashtable(&function_hash_table,0x1000,strhash,strcmp);
  create_hashtable(&notfound_binding_table,0x80,strhash,strcmp);
  handle_libdl();
  return;
}

Assistant:

void gotcha_init() {
  static int gotcha_initialized = 0;
  if (gotcha_initialized) {
    return;
  }
  gotcha_initialized = 1;
  debug_init();
  setup_hash_tables();
  handle_libdl();
}